

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall cmLocalGenerator::GenerateInstallRules(cmLocalGenerator *this)

{
  cmOutputConverter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  pointer puVar4;
  cmInstallGenerator *pcVar5;
  char cVar6;
  cmLocalGenerator *pcVar7;
  bool bVar8;
  int iVar9;
  cmValue cVar10;
  string *psVar11;
  undefined8 extraout_RAX;
  ostream *poVar12;
  PolicyID id;
  pointer this_01;
  const_iterator __begin2;
  undefined *puVar13;
  pointer puVar14;
  const_iterator __end2;
  string *configurationType;
  string *s;
  bool haveInstallAfterSubdirectory;
  bool haveSubdirectoryInstall;
  string odir;
  string default_config;
  string prefix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  string homedir;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> children;
  string file;
  string config;
  ostringstream e;
  cmGeneratedFileStream fout;
  char local_536 [2];
  undefined4 local_534;
  string local_530;
  PolicyStatus local_50c;
  long *local_508;
  long local_500;
  long local_4f8 [2];
  long *local_4e8;
  char *local_4e0;
  long local_4d8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  long *local_4b0;
  size_t local_4a8;
  long local_4a0 [2];
  cmLocalGenerator *local_490;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_488;
  string local_470;
  string local_450;
  string local_430;
  undefined1 local_410 [16];
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> local_400 [2];
  ios_base local_3a0 [264];
  undefined1 local_298 [616];
  
  pcVar2 = this->Makefile;
  local_298._0_8_ = local_298 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_INSTALL_PREFIX","");
  cVar10 = cmMakefile::GetDefinition(pcVar2,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  psVar11 = cVar10.Value;
  if (cVar10.Value == (string *)0x0) {
    psVar11 = &cmValue::Empty_abi_cxx11_;
  }
  local_4e8 = local_4d8;
  pcVar3 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,pcVar3,pcVar3 + psVar11->_M_string_length);
  if (cVar10.Value == (string *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_4e8,0,local_4e0,0x7dcc8f);
  }
  pcVar2 = this->Makefile;
  local_298._0_8_ = local_298 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_STAGING_PREFIX","");
  cVar10 = cmMakefile::GetDefinition(pcVar2,(string *)local_298);
  if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  if (cVar10.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&local_4e8);
  }
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_4c8,this->Makefile,OnlyMultiConfig);
  cmMakefile::GetDefaultConfiguration_abi_cxx11_(&local_450,this->Makefile);
  local_508 = local_4f8;
  local_490 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_508,local_450._M_dataplus._M_p,
             local_450._M_dataplus._M_p + local_450._M_string_length);
  if (local_500 == 0) {
    puVar13 = &DAT_009bdf90;
    s = local_4c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
    psVar11 = local_4c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      for (; s != psVar11; s = s + 1) {
        cmsys::SystemTools::UpperCase((string *)local_298,s);
        iVar9 = std::__cxx11::string::compare((char *)local_298);
        if ((undefined1 *)local_298._0_8_ != local_298 + 0x10) {
          operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
        }
        if (iVar9 == 0) {
          std::__cxx11::string::_M_assign((string *)&local_508);
        }
      }
    } while ((*(long *)(puVar13 + 8) != 0) &&
            (puVar13 = puVar13 + 8,
            s = local_4c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
            psVar11 = local_4c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish, local_500 == 0));
  }
  if ((local_500 == 0) &&
     (local_4c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_4c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::string::_M_assign((string *)&local_508);
  }
  pcVar7 = local_490;
  this_00 = &local_490->super_cmOutputConverter;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_298,&this_00->StateSnapshot);
  psVar11 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_298);
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  pcVar3 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_470,pcVar3,pcVar3 + psVar11->_M_string_length);
  psVar11 = cmState::GetBinaryDirectory_abi_cxx11_
                      ((pcVar7->GlobalGenerator->CMakeInstance->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  local_4b0 = local_4a0;
  pcVar3 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4b0,pcVar3,pcVar3 + psVar11->_M_string_length);
  if (local_470._M_string_length == local_4a8) {
    if (local_470._M_string_length == 0) {
      local_534 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    else {
      iVar9 = bcmp(local_470._M_dataplus._M_p,local_4b0,local_470._M_string_length);
      local_534 = CONCAT31((int3)((uint)iVar9 >> 8),iVar9 == 0);
    }
  }
  else {
    local_534 = 0;
  }
  std::__cxx11::string::append((char *)&local_470);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,&local_470,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_298,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,"# Install script for directory: ",0x20);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_410,&this_00->StateSnapshot);
  psVar11 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_410);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,(psVar11->_M_dataplus)._M_p,psVar11->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             "\n\n# Set the install prefix\nif(NOT DEFINED CMAKE_INSTALL_PREFIX)\n  set(CMAKE_INSTALL_PREFIX \""
             ,0x5c);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,(char *)local_4e8,(long)local_4e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"string(REGEX REPLACE \"/$\" \"\" CMAKE_INSTALL_PREFIX ",0x32);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,"\"${CMAKE_INSTALL_PREFIX}\")\n\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,
             "# Set the install configuration name.\nif(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n  if(BUILD_TYPE)\n    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n  else()\n    set(CMAKE_INSTALL_CONFIG_NAME \""
             ,0xf1);
  poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_298,(char *)local_508,local_500);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar12,
             "\")\n  endif()\n  message(STATUS \"Install configuration: \\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\nendif()\n\n"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_298,
             "# Set the component getting installed.\nif(NOT CMAKE_INSTALL_COMPONENT)\n  if(COMPONENT)\n    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n  else()\n    set(CMAKE_INSTALL_COMPONENT)\n  endif()\nendif()\n\n"
             ,0xfe);
  pcVar2 = pcVar7->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CMAKE_INSTALL_SO_NO_EXE","");
  cVar10 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar10.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Install shared libraries without execute permission?\nif(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n  set(CMAKE_INSTALL_SO_NO_EXE \""
               ,0x7e);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar10.Value)->_M_dataplus)._M_p,
                         (cVar10.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = pcVar7->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CMAKE_CROSSCOMPILING","");
  cVar10 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar10.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Is this installation the result of a crosscompile?\nif(NOT DEFINED CMAKE_CROSSCOMPILING)\n  set(CMAKE_CROSSCOMPILING \""
               ,0x76);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar10.Value)->_M_dataplus)._M_p,
                         (cVar10.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = pcVar7->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_410,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS","");
  cVar10 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar10.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
               ,0x9c);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar10.Value)->_M_dataplus)._M_p,
                         (cVar10.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = pcVar7->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_410,"CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM","");
  cVar10 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar10.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM)\n  set(CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM \""
               ,0x94);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar10.Value)->_M_dataplus)._M_p,
                         (cVar10.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = pcVar7->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_410,"CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL","");
  cVar10 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar10.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL)\n  set(CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL \""
               ,0x8c);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar10.Value)->_M_dataplus)._M_p,
                         (cVar10.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = pcVar7->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_410,"CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND","");
  cVar10 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar10.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND)\n  set(CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND \""
               ,0x92);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar10.Value)->_M_dataplus)._M_p,
                         (cVar10.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  pcVar2 = pcVar7->Makefile;
  local_410._0_8_ = local_400;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"CMAKE_OBJDUMP","");
  cVar10 = cmMakefile::GetDefinition(pcVar2,(string *)local_410);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_410._0_8_ != local_400) {
    operator_delete((void *)local_410._0_8_,
                    (ulong)((long)local_400[0].Data.
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  if (cVar10.Value != (string *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "# Set default install directory permissions.\nif(NOT DEFINED CMAKE_OBJDUMP)\n  set(CMAKE_OBJDUMP \""
               ,0x60);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,((cVar10.Value)->_M_dataplus)._M_p,
                         (cVar10.Value)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\")\nendif()\n\n",0xc);
  }
  (*pcVar7->_vptr_cmLocalGenerator[0x12])(pcVar7,local_298);
  local_50c = cmMakefile::GetPolicyStatus(pcVar7->Makefile,CMP0082,false);
  local_536[1] = 0;
  local_536[0] = '\0';
  puVar14 = (pcVar7->Makefile->InstallGenerators).
            super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (pcVar7->Makefile->InstallGenerators).
           super__Vector_base<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_50c == WARN) {
    if (puVar14 != puVar4) {
      do {
        pcVar5 = (puVar14->_M_t).
                 super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                 .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl;
        (**(code **)((long)(pcVar5->super_cmScriptGenerator)._vptr_cmScriptGenerator + 0x48))
                  (pcVar5,local_536 + 1,local_536);
        cmScriptGenerator::Generate
                  (&((puVar14->_M_t).
                     super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                     .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl)->
                    super_cmScriptGenerator,(ostream *)local_298,&local_450,&local_4c8);
        puVar14 = puVar14 + 1;
      } while (puVar14 != puVar4);
    }
  }
  else if (puVar14 != puVar4) {
    do {
      cmScriptGenerator::Generate
                (&((puVar14->_M_t).
                   super___uniq_ptr_impl<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmInstallGenerator_*,_std::default_delete<cmInstallGenerator>_>
                   .super__Head_base<0UL,_cmInstallGenerator_*,_false>._M_head_impl)->
                  super_cmScriptGenerator,(ostream *)local_298,&local_450,&local_4c8);
      puVar14 = puVar14 + 1;
    } while (puVar14 != puVar4);
  }
  pcVar7 = local_490;
  GenerateTargetInstallRules(local_490,(ostream *)local_298,&local_450,&local_4c8);
  cVar6 = local_536[0];
  if (local_50c != OLD) {
    if (local_50c != WARN) goto LAB_004492d8;
    if (local_536[0] == '\x01') {
      pcVar2 = pcVar7->Makefile;
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_430,"CMAKE_POLICY_WARNING_CMP0082","");
      bVar8 = cmMakefile::PolicyOptionalWarningEnabled(pcVar2,&local_430);
    }
    else {
      bVar8 = false;
    }
    if ((cVar6 != '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2)) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    if (bVar8 != false) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_410);
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_530,(cmPolicies *)0x52,id);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_410,local_530._M_dataplus._M_p,
                           local_530._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(pcVar7->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_530,
                          &pcVar7->DirectoryBacktrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_410);
      std::ios_base::~ios_base(local_3a0);
    }
  }
  cmMakefile::GetStateSnapshot(pcVar7->Makefile);
  cmStateSnapshot::GetChildren(&local_488,(cmStateSnapshot *)local_410);
  if (local_488.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_488.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,"  # Include the install script for each subdirectory.\n",0x36);
    if (local_488.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_488.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar1 = &local_530.field_2;
      this_01 = local_488.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_410,this_01);
        local_530._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"EXCLUDE_FROM_ALL","");
        bVar8 = cmStateDirectory::GetPropertyAsBool((cmStateDirectory *)local_410,&local_530);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._M_dataplus._M_p != paVar1) {
          operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
        }
        if (!bVar8) {
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_410,this_01);
          psVar11 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_410);
          pcVar3 = (psVar11->_M_dataplus)._M_p;
          local_530._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_530,pcVar3,pcVar3 + psVar11->_M_string_length);
          cmsys::SystemTools::ConvertToUnixSlashes(&local_530);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_298,"  include(\"",0xb);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_298,local_530._M_dataplus._M_p,
                               local_530._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,"/cmake_install.cmake\")\n",0x17);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._M_dataplus._M_p != paVar1) {
            operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
          }
        }
        this_01 = this_01 + 1;
      } while (this_01 !=
               local_488.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_298,"endif()\n\n",9);
  }
  if (local_488.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start != (cmStateSnapshot *)0x0) {
    operator_delete(local_488.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_488.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_488.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_004492d8:
  if ((char)local_534 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_298,
               "if(CMAKE_INSTALL_COMPONENT)\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest_${CMAKE_INSTALL_COMPONENT}.txt\")\nelse()\n  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\nendif()\n\nstring(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\nfile(WRITE \""
               ,0x11e);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_298,(char *)local_4b0,local_4a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"/${CMAKE_INSTALL_MANIFEST}\"\n     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n"
               ,0x46);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  if (local_4b0 != local_4a0) {
    operator_delete(local_4b0,local_4a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if (local_508 != local_4f8) {
    operator_delete(local_508,local_4f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c8);
  if (local_4e8 != local_4d8) {
    operator_delete(local_4e8,local_4d8[0] + 1);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateInstallRules()
{
  // Compute the install prefix.
  cmValue installPrefix =
    this->Makefile->GetDefinition("CMAKE_INSTALL_PREFIX");
  std::string prefix = installPrefix;

#if defined(_WIN32) && !defined(__CYGWIN__)
  if (!installPrefix) {
    if (!cmSystemTools::GetEnv("SystemDrive", prefix)) {
      prefix = "C:";
    }
    cmValue project_name = this->Makefile->GetDefinition("PROJECT_NAME");
    if (cmNonempty(project_name)) {
      prefix += "/Program Files/";
      prefix += *project_name;
    } else {
      prefix += "/InstalledCMakeProject";
    }
  }
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (!installPrefix) {
    if (find_directory(B_SYSTEM_DIRECTORY, -1, false, dir, sizeof(dir)) ==
        B_OK) {
      prefix = dir;
    } else {
      prefix = "/boot/system";
    }
  }
#else
  if (!installPrefix) {
    prefix = "/usr/local";
  }
#endif
  if (cmValue stagingPrefix =
        this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX")) {
    prefix = *stagingPrefix;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes =
    this->Makefile->GetGeneratorConfigs(cmMakefile::OnlyMultiConfig);
  std::string config = this->Makefile->GetDefaultConfiguration();

  // Choose a default install configuration.
  std::string default_config = config;
  const char* default_order[] = { "RELEASE", "MINSIZEREL", "RELWITHDEBINFO",
                                  "DEBUG", nullptr };
  for (const char** c = default_order; *c && default_config.empty(); ++c) {
    for (std::string const& configurationType : configurationTypes) {
      if (cmSystemTools::UpperCase(configurationType) == *c) {
        default_config = configurationType;
      }
    }
  }
  if (default_config.empty() && !configurationTypes.empty()) {
    default_config = configurationTypes[0];
  }

  // Create the install script file.
  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  std::string homedir = this->GetState()->GetBinaryDirectory();
  int toplevel_install = 0;
  if (file == homedir) {
    toplevel_install = 1;
  }
  file += "/cmake_install.cmake";
  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  // Write the header.
  /* clang-format off */
  fout << "# Install script for directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource()
       << "\n\n"
          "# Set the install prefix\n"
          "if(NOT DEFINED CMAKE_INSTALL_PREFIX)\n"
          "  set(CMAKE_INSTALL_PREFIX \"" << prefix << "\")\n"
          "endif()\n"
       << R"(string(REGEX REPLACE "/$" "" CMAKE_INSTALL_PREFIX )"
       << "\"${CMAKE_INSTALL_PREFIX}\")\n\n";
  /* clang-format on */

  // Write support code for generating per-configuration install rules.
  /* clang-format off */
  fout <<
    "# Set the install configuration name.\n"
    "if(NOT DEFINED CMAKE_INSTALL_CONFIG_NAME)\n"
    "  if(BUILD_TYPE)\n"
    "    string(REGEX REPLACE \"^[^A-Za-z0-9_]+\" \"\"\n"
    "           CMAKE_INSTALL_CONFIG_NAME \"${BUILD_TYPE}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_CONFIG_NAME \"" << default_config << "\")\n"
    "  endif()\n"
    "  message(STATUS \"Install configuration: "
    "\\\"${CMAKE_INSTALL_CONFIG_NAME}\\\"\")\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Write support code for dealing with component-specific installs.
  /* clang-format off */
  fout <<
    "# Set the component getting installed.\n"
    "if(NOT CMAKE_INSTALL_COMPONENT)\n"
    "  if(COMPONENT)\n"
    "    message(STATUS \"Install component: \\\"${COMPONENT}\\\"\")\n"
    "    set(CMAKE_INSTALL_COMPONENT \"${COMPONENT}\")\n"
    "  else()\n"
    "    set(CMAKE_INSTALL_COMPONENT)\n"
    "  endif()\n"
    "endif()\n"
    "\n";
  /* clang-format on */

  // Copy user-specified install options to the install code.
  if (cmValue so_no_exe =
        this->Makefile->GetDefinition("CMAKE_INSTALL_SO_NO_EXE")) {
    /* clang-format off */
    fout <<
      "# Install shared libraries without execute permission?\n"
      "if(NOT DEFINED CMAKE_INSTALL_SO_NO_EXE)\n"
      "  set(CMAKE_INSTALL_SO_NO_EXE \"" << *so_no_exe << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Copy cmake cross compile state to install code.
  if (cmValue crosscompiling =
        this->Makefile->GetDefinition("CMAKE_CROSSCOMPILING")) {
    /* clang-format off */
    fout <<
      "# Is this installation the result of a crosscompile?\n"
      "if(NOT DEFINED CMAKE_CROSSCOMPILING)\n"
      "  set(CMAKE_CROSSCOMPILING \"" << *crosscompiling << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write default directory permissions.
  if (cmValue defaultDirPermissions = this->Makefile->GetDefinition(
        "CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS)\n"
      "  set(CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS \""
         << *defaultDirPermissions << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM so that
  // installed code that uses `file(GET_RUNTIME_DEPENDENCIES)`
  // has same platform variable as when running cmake
  if (cmValue platform = this->Makefile->GetDefinition(
        "CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM)\n"
      "  set(CMAKE_GET_RUNTIME_DEPENDENCIES_PLATFORM \""
         << *platform << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL so that
  // installed code that uses `file(GET_RUNTIME_DEPENDENCIES)`
  // has same tool selected as when running cmake
  if (cmValue command =
        this->Makefile->GetDefinition("CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL)\n"
      "  set(CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL \""
         << *command << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND so that
  // installed code that uses `file(GET_RUNTIME_DEPENDENCIES)`
  // has same path to the tool as when running cmake
  if (cmValue command = this->Makefile->GetDefinition(
        "CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND)\n"
      "  set(CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND \""
         << *command << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  // Write out CMAKE_OBJDUMP so that installed code that uses
  // `file(GET_RUNTIME_DEPENDENCIES)` and hasn't specified
  // CMAKE_GET_RUNTIME_DEPENDENCIES_COMMAND has consistent
  // logic to fallback to CMAKE_OBJDUMP when `objdump` is
  // not on the path
  if (cmValue command = this->Makefile->GetDefinition("CMAKE_OBJDUMP")) {
    /* clang-format off */
    fout <<
      "# Set default install directory permissions.\n"
      "if(NOT DEFINED CMAKE_OBJDUMP)\n"
      "  set(CMAKE_OBJDUMP \""
         << *command << "\")\n"
      "endif()\n"
      "\n";
    /* clang-format on */
  }

  this->AddGeneratorSpecificInstallSetup(fout);

  // Ask each install generator to write its code.
  cmPolicies::PolicyStatus status = this->GetPolicyStatus(cmPolicies::CMP0082);
  auto const& installers = this->Makefile->GetInstallGenerators();
  bool haveSubdirectoryInstall = false;
  bool haveInstallAfterSubdirectory = false;
  if (status == cmPolicies::WARN) {
    for (const auto& installer : installers) {
      installer->CheckCMP0082(haveSubdirectoryInstall,
                              haveInstallAfterSubdirectory);
      installer->Generate(fout, config, configurationTypes);
    }
  } else {
    for (const auto& installer : installers) {
      installer->Generate(fout, config, configurationTypes);
    }
  }

  // Write rules from old-style specification stored in targets.
  this->GenerateTargetInstallRules(fout, config, configurationTypes);

  // Include install scripts from subdirectories.
  switch (status) {
    case cmPolicies::WARN:
      if (haveInstallAfterSubdirectory &&
          this->Makefile->PolicyOptionalWarningEnabled(
            "CMAKE_POLICY_WARNING_CMP0082")) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0082) << "\n";
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD: {
      std::vector<cmStateSnapshot> children =
        this->Makefile->GetStateSnapshot().GetChildren();
      if (!children.empty()) {
        fout << "if(NOT CMAKE_INSTALL_LOCAL_ONLY)\n";
        fout << "  # Include the install script for each subdirectory.\n";
        for (cmStateSnapshot const& c : children) {
          if (!c.GetDirectory().GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
            std::string odir = c.GetDirectory().GetCurrentBinary();
            cmSystemTools::ConvertToUnixSlashes(odir);
            fout << "  include(\"" << odir << "/cmake_install.cmake\")\n";
          }
        }
        fout << "\n";
        fout << "endif()\n\n";
      }
    } break;

    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // NEW behavior is handled in
      // cmInstallSubdirectoryGenerator::GenerateScript()
      break;
  }

  // Record the install manifest.
  if (toplevel_install) {
    /* clang-format off */
    fout <<
      "if(CMAKE_INSTALL_COMPONENT)\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest_"
      "${CMAKE_INSTALL_COMPONENT}.txt\")\n"
      "else()\n"
      "  set(CMAKE_INSTALL_MANIFEST \"install_manifest.txt\")\n"
      "endif()\n"
      "\n"
      "string(REPLACE \";\" \"\\n\" CMAKE_INSTALL_MANIFEST_CONTENT\n"
      "       \"${CMAKE_INSTALL_MANIFEST_FILES}\")\n"
      "file(WRITE \"" << homedir << "/${CMAKE_INSTALL_MANIFEST}\"\n"
      "     \"${CMAKE_INSTALL_MANIFEST_CONTENT}\")\n";
    /* clang-format on */
  }
}